

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  _Bool _Var7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  uint uVar11;
  imapstate iVar12;
  CURLofft CVar13;
  ulong uVar14;
  size_t sVar15;
  imapstate instate;
  size_t __n;
  Curl_easy *pCVar16;
  char *pcVar17;
  byte *ptr;
  curl_off_t size;
  int imapcode;
  size_t nread;
  size_t local_78 [4];
  Curl_easy *local_58;
  CURLcode local_4c;
  SASL *local_48;
  size_t local_40;
  char *local_38;
  
  sockfd = conn->sock[0];
  local_40 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar8 = imap_perform_upgrade_tls(conn);
    return CVar8;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar8;
  }
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar8 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,(int *)&local_4c,&local_40);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (local_4c == ~CURLE_OK) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_4c == CURLE_OK) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (local_4c != CURLE_UNSUPPORTED_PROTOCOL) {
        pCVar16 = conn->data;
        if (local_4c != CURLE_URL_MALFORMAT) {
          Curl_failf(pCVar16,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (conn->proto).imapc.preauth = true;
        Curl_infof(pCVar16,"PREAUTH connection, already authenticated!\n");
      }
      (conn->proto).ftpc.diralloc = 0;
      *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
      (conn->proto).imapc.tls_supported = false;
      CVar8 = imap_sendf(conn,"CAPABILITY");
      iVar12 = IMAP_CAPABILITY;
LAB_00131786:
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      (conn->proto).imapc.state = iVar12;
      goto LAB_00131ab3;
    case IMAP_CAPABILITY:
      pCVar16 = conn->data;
      if (local_4c == CURLE_UNSUPPORTED_PROTOCOL) {
        cVar3 = (pCVar16->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).imapc.tls_supported == true) {
            CVar8 = imap_sendf(conn,"STARTTLS");
            iVar12 = IMAP_STARTTLS;
            goto LAB_00131786;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            pcVar17 = "STARTTLS not supported.";
            goto LAB_00131cf8;
          }
        }
      }
      else if (local_4c == CURLE_ABORTED_BY_CALLBACK) {
        ptr = (byte *)((pCVar16->state).buffer + 2);
LAB_001317dd:
        do {
          uVar14 = (ulong)*ptr;
          if (uVar14 < 0x21) {
            if ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0) {
              ptr = ptr + 1;
              goto LAB_001317dd;
            }
            if (uVar14 == 0) goto LAB_00131aa6;
          }
          sVar15 = 0xfffffffffffffffb;
          while ((0x20 < (byte)uVar14 || ((0x100002601U >> (uVar14 & 0x3f) & 1) == 0))) {
            lVar6 = sVar15 + 6;
            sVar15 = sVar15 + 1;
            uVar14 = (ulong)ptr[lVar6];
          }
          uVar14 = sVar15 + 5;
          if (uVar14 == 7) {
            if (*(int *)(ptr + 3) != 0x52492d4c || *(int *)ptr != 0x4c534153) goto LAB_001318b4;
            (conn->proto).imapc.ir_supported = true;
            uVar14 = 7;
          }
          else if (uVar14 == 0xd) {
            if (*(long *)(ptr + 5) != 0x44454c4241534944 || *(long *)ptr != 0x5349444e49474f4c)
            goto LAB_001318b4;
            (conn->proto).imapc.login_disabled = true;
            uVar14 = 0xd;
          }
          else if (uVar14 == 8) {
            if (*(long *)ptr != 0x534c545452415453) goto LAB_001318b4;
            (conn->proto).imapc.tls_supported = true;
            uVar14 = 8;
          }
          else if (5 < uVar14) {
LAB_001318b4:
            if (ptr[4] == 0x3d && *(int *)ptr == 0x48545541) {
              ptr = ptr + 5;
              uVar11 = Curl_sasl_decode_mech((char *)ptr,sVar15,local_78);
              uVar14 = sVar15;
              if ((uVar11 != 0) && (local_78[0] == sVar15)) {
                piVar1 = &(conn->proto).ftpc.diralloc;
                *piVar1 = *piVar1 | uVar11;
              }
            }
          }
          ptr = ptr + uVar14;
        } while( true );
      }
LAB_00131a92:
      CVar9 = imap_perform_authentication(conn);
      break;
    case IMAP_STARTTLS:
      if (local_4c != CURLE_UNSUPPORTED_PROTOCOL) {
        pCVar16 = conn->data;
        if ((pCVar16->set).use_ssl != CURLUSESSL_TRY) {
          pcVar17 = "STARTTLS denied";
LAB_00131cf8:
          Curl_failf(pCVar16,pcVar17);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00131a92;
      }
      CVar9 = imap_perform_upgrade_tls(conn);
      break;
    default:
      goto switchD_00131622_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar16 = conn->data;
      CVar9 = Curl_sasl_continue(local_48,conn,local_4c,(saslprogress *)local_78);
      if (CVar9 == CURLE_OK) {
        if ((saslprogress)local_78[0] == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled != false) ||
             (((conn->proto).ftpc.cwdfail & 1U) == 0)) {
            pcVar17 = "Authentication cancelled";
            goto LAB_00131a69;
          }
          CVar9 = imap_perform_login(conn);
        }
        else {
          CVar9 = CURLE_OK;
          CVar8 = CURLE_OK;
          if ((saslprogress)local_78[0] == SASL_DONE) goto LAB_00131a3d;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_4c != CURLE_UNSUPPORTED_PROTOCOL) {
        Curl_failf(conn->data,"Access denied. %c",(ulong)local_4c);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_00131622_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      CVar9 = imap_state_listsearch_resp(conn,local_4c,instate);
      break;
    case IMAP_SELECT:
      pCVar16 = conn->data;
      if (local_4c == CURLE_UNSUPPORTED_PROTOCOL) {
        pvVar4 = (pCVar16->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) == (char *)0x0) ||
            (pcVar17 = (conn->proto).imapc.mailbox_uidvalidity, pcVar17 == (char *)0x0)) ||
           (iVar10 = Curl_strcasecompare(*(char **)((long)pvVar4 + 0x10),pcVar17), iVar10 != 0)) {
          pcVar17 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
          (conn->proto).imapc.mailbox = pcVar17;
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            if (*(long *)((long)pvVar4 + 0x30) == 0) {
              CVar9 = imap_perform_fetch(conn);
            }
            else {
              CVar9 = imap_perform_search(conn);
            }
          }
          else {
            CVar9 = imap_perform_list(conn);
          }
        }
        else {
          Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
          CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else if (local_4c == CURLE_ABORTED_BY_CALLBACK) {
        CVar9 = CURLE_OK;
        iVar10 = __isoc99_sscanf((pCVar16->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                 local_78);
        if (iVar10 == 1) {
          (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
          (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
          pcVar17 = (*Curl_cstrdup)((char *)local_78);
          (conn->proto).imapc.mailbox_uidvalidity = pcVar17;
        }
      }
      else {
        pcVar17 = "Select failed";
LAB_00131a69:
        Curl_failf(pCVar16,pcVar17);
        CVar9 = CURLE_LOGIN_DENIED;
      }
      break;
    case IMAP_FETCH:
      pCVar16 = conn->data;
      pcVar17 = (pCVar16->state).buffer;
      local_78[0] = 0;
      if (local_4c == CURLE_ABORTED_BY_CALLBACK) {
        pcVar5 = pcVar17;
        while( true ) {
          if (*pcVar5 == '\0') break;
          if (*pcVar5 == '{') {
            local_58 = pCVar16;
            CVar13 = curlx_strtoofft(pcVar5 + 1,&local_38,10,(curl_off_t *)local_78);
            pCVar16 = local_58;
            if ((((CVar13 == CURL_OFFT_OK) && (1 < (long)local_38 - (long)pcVar17)) &&
                (*local_38 == '}')) && ((local_38[1] == '\r' && (local_38[2] == '\0')))) {
              Curl_infof(local_58,"Found %lu bytes to download\n",local_78[0]);
              Curl_pgrsSetDownloadSize(pCVar16,local_78[0]);
              pcVar17 = (pp->ftpc).pp.cache;
              if (pcVar17 != (char *)0x0) {
                uVar14 = (conn->proto).ftpc.pp.cache_size;
                sVar15 = local_78[0];
                if (uVar14 < local_78[0]) {
                  sVar15 = uVar14;
                }
                if (sVar15 == 0) {
                  CVar8 = CURLE_OK;
                  goto LAB_00131a3d;
                }
                CVar9 = Curl_client_write(conn,1,pcVar17,sVar15);
                if (CVar9 != CURLE_OK) goto LAB_00131a9d;
                pcVar2 = &(local_58->req).bytecount;
                *pcVar2 = *pcVar2 + sVar15;
                Curl_infof(local_58,"Written %lu bytes, %lu bytes are left for transfer\n",sVar15);
                uVar14 = (conn->proto).ftpc.pp.cache_size;
                __n = uVar14 - sVar15;
                if (uVar14 < sVar15 || __n == 0) {
                  (*Curl_cfree)((pp->ftpc).pp.cache);
                  (pp->ftpc).pp.cache = (char *)0x0;
                  sVar15 = 0;
                }
                else {
                  memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + sVar15),__n);
                  sVar15 = (conn->proto).ftpc.pp.cache_size - sVar15;
                }
                (conn->proto).ftpc.pp.cache_size = sVar15;
              }
              if ((local_58->req).bytecount == local_78[0]) {
                iVar10 = -1;
                sVar15 = 0xffffffffffffffff;
              }
              else {
                (local_58->req).maxdownload = local_78[0];
                iVar10 = 0;
                sVar15 = local_78[0];
              }
              Curl_setup_transfer(conn,iVar10,sVar15,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              CVar8 = CURLE_OK;
              goto LAB_00131a3d;
            }
            break;
          }
          pcVar17 = pcVar17 + 1;
          pcVar5 = pcVar5 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar16,-1);
        CVar8 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00131a3d:
      CVar9 = CVar8;
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (local_4c != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      goto switchD_00131622_caseD_4;
    case IMAP_APPEND:
      if (local_4c == CURLE_BAD_FUNCTION_ARGUMENT) {
        Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      }
      return CURLE_UPLOAD_FAILED;
    case IMAP_APPEND_FINAL:
      if (local_4c != CURLE_UNSUPPORTED_PROTOCOL) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_00131622_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    }
LAB_00131a9d:
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
LAB_00131aa6:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00131ab3:
    _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}